

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_stop(MppDecVprocCtx ctx)

{
  MppDecVprocCtxImpl *p;
  MppDecVprocCtx ctx_local;
  
  if (ctx == (MppDecVprocCtx)0x0) {
    _mpp_log_l(2,"mpp_dec_vproc","found NULL input\n","dec_vproc_stop");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vproc_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","in\n","dec_vproc_stop");
    }
    if (*(long *)((long)ctx + 0x18) == 0) {
      _mpp_log_l(2,"mpp_dec_vproc","failed to stop dec vproc thread\n",(char *)0x0);
    }
    else {
      MppThread::stop(*(MppThread **)((long)ctx + 0x18));
    }
    if ((vproc_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","out\n","dec_vproc_stop");
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET dec_vproc_stop(MppDecVprocCtx ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }
    vproc_dbg_func("in\n");

    MppDecVprocCtxImpl *p = (MppDecVprocCtxImpl *)ctx;

    if (p->thd)
        p->thd->stop();
    else
        mpp_err("failed to stop dec vproc thread\n");

    vproc_dbg_func("out\n");
    return MPP_OK;
}